

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpxpes_parser.cc
# Opt level: O1

bool __thiscall
libwebm::VpxPesParser::RemoveStartCodeEmulationPreventionBytes
          (VpxPesParser *this,uint8_t *raw_data,size_t bytes_required,PacketData *processed_data,
          size_t *bytes_consumed)

{
  pointer *ppuVar1;
  iterator __position;
  bool bVar2;
  long lVar3;
  size_t sVar4;
  uchar *puVar5;
  long lVar6;
  ulong uVar7;
  uint8_t byte;
  uchar local_41;
  size_t *local_40;
  uchar *local_38;
  
  if (processed_data == (PacketData *)0x0 || bytes_required == 0) {
LAB_0010cb80:
    bVar2 = false;
  }
  else {
    puVar5 = *(uchar **)(this + 0x60);
    sVar4 = 0;
    uVar7 = 0;
    lVar3 = 0;
    local_40 = bytes_consumed;
    local_38 = puVar5;
    do {
      if (puVar5 < raw_data + sVar4) goto LAB_0010cb80;
      local_41 = raw_data[sVar4];
      lVar6 = lVar3 + 1;
      if (local_41 != '\0') {
        lVar6 = 0;
      }
      if ((local_41 != '\x03') || (lVar3 != 2)) {
        __position._M_current =
             (processed_data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (processed_data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          _M_realloc_insert<unsigned_char_const&>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)processed_data,
                     __position,&local_41);
          puVar5 = local_38;
        }
        else {
          *__position._M_current = local_41;
          ppuVar1 = &(processed_data->
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppuVar1 = *ppuVar1 + 1;
        }
        uVar7 = uVar7 + 1;
      }
      sVar4 = sVar4 + 1;
      lVar3 = lVar6;
    } while (uVar7 < bytes_required);
    *local_40 = sVar4;
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool VpxPesParser::RemoveStartCodeEmulationPreventionBytes(
    const std::uint8_t* raw_data, std::size_t bytes_required,
    PacketData* processed_data, std::size_t* bytes_consumed) const {
  if (bytes_required == 0 || !processed_data)
    return false;

  std::size_t num_zeros = 0;
  std::size_t bytes_copied = 0;
  const std::uint8_t* const end_of_input =
      &pes_file_data_[0] + pes_file_data_.size();
  std::size_t i;
  for (i = 0; bytes_copied < bytes_required; ++i) {
    if (raw_data + i > end_of_input)
      return false;

    bool skip = false;

    const std::uint8_t byte = raw_data[i];
    if (byte == 0) {
      ++num_zeros;
    } else if (byte == 0x3 && num_zeros == 2) {
      skip = true;
      num_zeros = 0;
    } else {
      num_zeros = 0;
    }

    if (skip == false) {
      processed_data->push_back(byte);
      ++bytes_copied;
    }
  }
  *bytes_consumed = i;
  return true;
}